

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_24939c::FloatExpr<long_double>::printLeft
          (FloatExpr<long_double> *this,OutputStream *s)

{
  int iVar1;
  char *pcVar2;
  int local_b0;
  int local_ac;
  StringView local_a0;
  int local_8c;
  char acStack_88 [4];
  int n;
  char num [40];
  uint d0;
  uint d1;
  char *e;
  char *t;
  anon_union_16_2_325080ff anon_var_0;
  undefined8 local_30;
  size_t N;
  char *last;
  char *first;
  OutputStream *s_local;
  FloatExpr<long_double> *this_local;
  
  first = (char *)s;
  s_local = (OutputStream *)this;
  last = StringView::begin(&this->Contents);
  pcVar2 = StringView::end(&this->Contents);
  local_30 = 0x14;
  if ((char *)0x14 < pcVar2 + (1 - (long)last)) {
    N = (size_t)(last + 0x14);
    _d0 = &t;
    for (e = last; e != (char *)N; e = e + 2) {
      iVar1 = isdigit((int)*e);
      if (iVar1 == 0) {
        local_ac = *e + -0x57;
      }
      else {
        local_ac = *e + -0x30;
      }
      num[0x24] = (undefined1)local_ac;
      num[0x25] = local_ac._1_1_;
      num[0x26] = local_ac._2_1_;
      num[0x27] = local_ac._3_1_;
      pcVar2 = e + 1;
      iVar1 = isdigit((int)*pcVar2);
      if (iVar1 == 0) {
        local_b0 = *pcVar2 + -0x57;
      }
      else {
        local_b0 = *pcVar2 + -0x30;
      }
      num[0x20] = (undefined1)local_b0;
      num[0x21] = local_b0._1_1_;
      num[0x22] = local_b0._2_1_;
      num[0x23] = local_b0._3_1_;
      *(char *)_d0 = (char)(num._36_4_ << 4) + (char)local_b0;
      _d0 = (char **)((long)_d0 + 1);
    }
    std::reverse<char*>((char *)&t,(char *)_d0);
    num[8] = '\0';
    num[9] = '\0';
    num[10] = '\0';
    num[0xb] = '\0';
    num[0xc] = '\0';
    num[0xd] = '\0';
    num[0xe] = '\0';
    num[0xf] = '\0';
    num[0x10] = '\0';
    num[0x11] = '\0';
    num[0x12] = '\0';
    num[0x13] = '\0';
    num[0x14] = '\0';
    num[0x15] = '\0';
    num[0x16] = '\0';
    num[0x17] = '\0';
    _acStack_88 = 0;
    num[0] = '\0';
    num[1] = '\0';
    num[2] = '\0';
    num[3] = '\0';
    num[4] = '\0';
    num[5] = '\0';
    num[6] = '\0';
    num[7] = '\0';
    num[0x18] = '\0';
    num[0x19] = '\0';
    num[0x1a] = '\0';
    num[0x1b] = '\0';
    num[0x1c] = '\0';
    num[0x1d] = '\0';
    num[0x1e] = '\0';
    num[0x1f] = '\0';
    local_8c = snprintf(acStack_88,0x28,"%LaL");
    StringView::StringView(&local_a0,acStack_88,num + (long)local_8c + -8);
    OutputStream::operator+=((OutputStream *)first,local_a0);
  }
  return;
}

Assistant:

void printLeft(OutputStream &s) const override {
    const char *first = Contents.begin();
    const char *last = Contents.end() + 1;

    const size_t N = FloatData<Float>::mangled_size;
    if (static_cast<std::size_t>(last - first) > N) {
      last = first + N;
      union {
        Float value;
        char buf[sizeof(Float)];
      };
      const char *t = first;
      char *e = buf;
      for (; t != last; ++t, ++e) {
        unsigned d1 = isdigit(*t) ? static_cast<unsigned>(*t - '0')
                                  : static_cast<unsigned>(*t - 'a' + 10);
        ++t;
        unsigned d0 = isdigit(*t) ? static_cast<unsigned>(*t - '0')
                                  : static_cast<unsigned>(*t - 'a' + 10);
        *e = static_cast<char>((d1 << 4) + d0);
      }
#if __BYTE_ORDER__ == __ORDER_LITTLE_ENDIAN__
      std::reverse(buf, e);
#endif
      char num[FloatData<Float>::max_demangled_size] = {0};
      int n = snprintf(num, sizeof(num), FloatData<Float>::spec, value);
      s += StringView(num, num + n);
    }
  }